

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_hashtbl_test.c
# Opt level: O0

int main(int argc,char **argv)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uo_strhashtbl *hashtbl_00;
  char *pcVar7;
  char *pcVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  ulong local_70;
  size_t i_5;
  size_t i_4;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  uo_strkvp_linklist *link;
  size_t i;
  char *value1;
  char *key1;
  uo_strhashtbl *hashtbl;
  _Bool passed;
  char **argv_local;
  int argc_local;
  
  hashtbl_00 = uo_strhashtbl_create(0);
  uo_strhashtbl_set(hashtbl_00,"key1","value1");
  sVar1 = hashtbl_00->count;
  pcVar7 = (char *)uo_strhashtbl_get(hashtbl_00,"key1");
  pcVar8 = (char *)uo_strhashtbl_remove(hashtbl_00,"key1");
  sVar2 = hashtbl_00->count;
  pvVar9 = uo_strhashtbl_get(hashtbl_00,"key1");
  bVar3 = (((sVar1 == 1 && pcVar7 == "value1") && pcVar8 == "value1") && sVar2 == 0) &&
          pvVar9 == (void *)0x0;
  for (link = (uo_strkvp_linklist *)0x0; link < (uo_strkvp_linklist *)0x1000;
      link = (uo_strkvp_linklist *)((long)&(link->link).next + 1)) {
    bVar3 = (bool)(bVar3 & (uo_strkvp_linklist *)hashtbl_00->count == link);
    uo_strhashtbl_set(hashtbl_00,lorem + (long)link,lorem + (long)link);
  }
  bVar4 = bVar3 & hashtbl_00->count == 0x1000;
  i_1 = (size_t)uo_strhashtbl_list(hashtbl_00);
  for (i_2 = 0; i_2 < 0x1000; i_2 = i_2 + 1) {
    i_1 = (size_t)uo_strkvp_linklist_next((uo_strkvp_linklist *)i_1);
    iVar5 = strcmp((char *)(((uo_strkvp_linklist *)i_1)->item).value,lorem + i_2);
    bVar4 = bVar4 & iVar5 == 0;
  }
  for (i_3 = 0; i_3 < 0x1000; i_3 = i_3 + 1) {
    pcVar7 = (char *)uo_strhashtbl_remove(hashtbl_00,lorem + i_3);
    bVar4 = bVar4 & pcVar7 == lorem + i_3;
    uo_strhashtbl_set(hashtbl_00,lorem + i_3,lorem + i_3);
  }
  for (i_4 = 0; i_4 < 0xf00; i_4 = i_4 + 1) {
    sVar1 = hashtbl_00->count;
    pcVar7 = (char *)uo_strhashtbl_remove(hashtbl_00,lorem + i_4);
    bVar4 = bVar4 & sVar1 == 0x1000 - i_4 & pcVar7 == lorem + i_4;
  }
  bVar4 = bVar4 & hashtbl_00->count == 0x100;
  i_1 = (size_t)uo_strhashtbl_list(hashtbl_00);
  for (i_5 = 0; i_5 < 0x100; i_5 = i_5 + 1) {
    i_1 = (size_t)uo_strkvp_linklist_prev((uo_strkvp_linklist *)i_1);
  }
  for (local_70 = 0xf00; local_70 < 0xfff; local_70 = local_70 + 1) {
    iVar5 = strcmp(*(char **)(i_1 + 0x18),lorem + local_70);
    bVar4 = bVar4 & iVar5 == 0;
    i_1 = (size_t)uo_strkvp_linklist_next((uo_strkvp_linklist *)i_1);
  }
  pvVar9 = uo_strhashtbl_get(hashtbl_00,"");
  pvVar10 = uo_strhashtbl_remove(hashtbl_00,"");
  uo_strhashtbl_set(hashtbl_00,"","");
  pcVar7 = (char *)uo_strhashtbl_get(hashtbl_00,"");
  iVar5 = strcmp(pcVar7,"");
  pcVar7 = (char *)uo_strhashtbl_remove(hashtbl_00,"");
  iVar6 = strcmp(pcVar7,"");
  pvVar11 = uo_strhashtbl_get(hashtbl_00,"");
  uo_strhashtbl_destroy(hashtbl_00);
  return (uint)!(bool)(bVar4 & pvVar9 == (void *)0x0 & pvVar10 == (void *)0x0 & iVar5 == 0 &
                       iVar6 == 0 & pvVar11 == (void *)0x0);
}

Assistant:

int main(
    int argc, 
    char const **argv)
{
    bool passed = true;

    uo_strhashtbl *hashtbl = uo_strhashtbl_create(0);
    const char *key1 = "key1";
    const char *value1 = "value1";
    uo_strhashtbl_set(hashtbl, key1, value1);
    passed &= hashtbl->count == 1;
    passed &= uo_strhashtbl_get(hashtbl, key1) == value1;
    passed &= uo_strhashtbl_remove(hashtbl, key1) == value1;
    passed &= hashtbl->count == 0;
    passed &= uo_strhashtbl_get(hashtbl, key1) == NULL;

    for (size_t i = 0; i < 0x1000; ++i)
    {
        passed &= hashtbl->count == i;
        uo_strhashtbl_set(hashtbl, lorem + i, lorem + i);
    }

    passed &= hashtbl->count == 0x1000;

    uo_strkvp_linklist *link = uo_strhashtbl_list(hashtbl);
    for (size_t i = 0; i < 0x1000; ++i)
    {
        link = uo_strkvp_linklist_next(link);
        passed &= strcmp(link->item.value, lorem + i) == 0;
    }

    for (size_t i = 0; i < 0x1000; ++i)
    {
        passed &= uo_strhashtbl_remove(hashtbl, lorem + i) == lorem + i;
        uo_strhashtbl_set(hashtbl, lorem + i, lorem + i);
    }

    for (size_t i = 0; i < (0x1000 - 0x100); ++i)
    {
        passed &= hashtbl->count == 0x1000 - i;
        passed &= uo_strhashtbl_remove(hashtbl, lorem + i) == lorem + i;
    }

    passed &= hashtbl->count == 0x100;

    link = uo_strhashtbl_list(hashtbl);

    for (size_t i = 0; i < 0x100; ++i)
        link = uo_strkvp_linklist_prev(link);

    for (size_t i = (0x1000 - 0x100); i < 0x1000 - 1; ++i)
    {
        passed &= strcmp(link->item.value, lorem + i) == 0;
        link = uo_strkvp_linklist_next(link);
    }

    passed &= uo_strhashtbl_get(hashtbl, "") == NULL;
    passed &= uo_strhashtbl_remove(hashtbl, "") == NULL;
    uo_strhashtbl_set(hashtbl, "", "");
    passed &= strcmp(uo_strhashtbl_get(hashtbl, ""), "") == 0;
    passed &= strcmp(uo_strhashtbl_remove(hashtbl, ""), "") == 0;
    passed &= uo_strhashtbl_get(hashtbl, "") == NULL;

    uo_strhashtbl_destroy(hashtbl);

    return passed ? 0 : 1;
}